

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      FreeContent((SUNNonlinearSolver)0x1392a0);
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL) { return SUN_SUCCESS; }

  /* free items from content structure, then the structure itself */
  if (NLS->content)
  {
    FreeContent(NLS);
    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops)
  {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the overall NLS structure */
  free(NLS);

  return SUN_SUCCESS;
}